

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::avx::BVHNIntersector1<4,_257,_false,_embree::avx::VirtualCurveIntersector1>::occluded
               (Intersectors *This,Ray *ray,RayQueryContext *context)

{
  float fVar1;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar2;
  float fVar3;
  float fVar4;
  bool bVar5;
  char cVar6;
  undefined4 uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  int iVar11;
  ulong uVar12;
  long lVar13;
  NodeRef *pNVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong unaff_R15;
  vint4 ai_1;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  vint4 ai;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  vint4 ai_3;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  vint4 ai_2;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  vint4 bi_7;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  vint4 bi_4;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  float fVar37;
  vfloat4 a0;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  float fVar40;
  float fVar41;
  float fVar45;
  float fVar46;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  float fVar47;
  float fVar48;
  float fVar52;
  float fVar53;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar60;
  float fVar61;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  float fVar62;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  vint4 bi;
  vint4 bi_2;
  Precalculations pre;
  NodeRef stack [244];
  
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    fVar41 = ray->tfar;
    if (0.0 <= fVar41) {
      aVar2 = (ray->dir).field_0.field_1;
      auVar27 = vdpps_avx((undefined1  [16])aVar2,(undefined1  [16])aVar2,0x7f);
      auVar28 = vrsqrtss_avx(auVar27,auVar27);
      fVar37 = auVar28._0_4_;
      pre.depth_scale = fVar37 * 1.5 - auVar27._0_4_ * 0.5 * fVar37 * fVar37 * fVar37;
      auVar23 = vshufps_avx(ZEXT416((uint)pre.depth_scale),ZEXT416((uint)pre.depth_scale),0);
      auVar38._0_4_ = aVar2.x * auVar23._0_4_;
      auVar38._4_4_ = aVar2.y * auVar23._4_4_;
      auVar38._8_4_ = aVar2.z * auVar23._8_4_;
      auVar38._12_4_ = aVar2.field_3.w * auVar23._12_4_;
      auVar28 = vshufpd_avx(auVar38,auVar38,1);
      auVar27 = vmovshdup_avx(auVar38);
      auVar63._8_4_ = 0x80000000;
      auVar63._0_8_ = 0x8000000080000000;
      auVar63._12_4_ = 0x80000000;
      auVar39._12_4_ = 0;
      auVar39._0_12_ = ZEXT812(0);
      auVar39 = auVar39 << 0x20;
      auVar32 = vunpckhps_avx(auVar38,auVar39);
      auVar24 = vshufps_avx(auVar32,ZEXT416(auVar27._0_4_ ^ 0x80000000),0x41);
      auVar42._0_8_ = auVar28._0_8_ ^ 0x8000000080000000;
      auVar42._8_8_ = auVar28._8_8_ ^ auVar63._8_8_;
      auVar32 = vinsertps_avx(auVar42,auVar38,0x2a);
      auVar27 = vdpps_avx(auVar24,auVar24,0x7f);
      auVar28 = vdpps_avx(auVar32,auVar32,0x7f);
      auVar27 = vcmpps_avx(auVar28,auVar27,1);
      auVar27 = vshufps_avx(auVar27,auVar27,0);
      auVar27 = vblendvps_avx(auVar32,auVar24,auVar27);
      auVar28 = vdpps_avx(auVar27,auVar27,0x7f);
      fVar37 = (ray->dir).field_0.m128[0];
      auVar32 = vrsqrtss_avx(auVar28,auVar28);
      fVar55 = auVar32._0_4_;
      fVar1 = (ray->dir).field_0.m128[1];
      auVar28 = ZEXT416((uint)(fVar55 * 1.5 - auVar28._0_4_ * 0.5 * fVar55 * fVar55 * fVar55));
      auVar28 = vshufps_avx(auVar28,auVar28,0);
      auVar43._0_4_ = auVar27._0_4_ * auVar28._0_4_;
      auVar43._4_4_ = auVar27._4_4_ * auVar28._4_4_;
      auVar43._8_4_ = auVar27._8_4_ * auVar28._8_4_;
      auVar43._12_4_ = auVar27._12_4_ * auVar28._12_4_;
      auVar27 = vshufps_avx(auVar43,auVar43,0xc9);
      auVar28 = vshufps_avx(auVar38,auVar38,0xc9);
      auVar57._0_4_ = auVar28._0_4_ * auVar43._0_4_;
      auVar57._4_4_ = auVar28._4_4_ * auVar43._4_4_;
      auVar57._8_4_ = auVar28._8_4_ * auVar43._8_4_;
      auVar57._12_4_ = auVar28._12_4_ * auVar43._12_4_;
      auVar49._0_4_ = auVar27._0_4_ * auVar38._0_4_;
      auVar49._4_4_ = auVar27._4_4_ * auVar38._4_4_;
      auVar49._8_4_ = auVar27._8_4_ * auVar38._8_4_;
      auVar49._12_4_ = auVar27._12_4_ * auVar38._12_4_;
      auVar27 = vsubps_avx(auVar49,auVar57);
      auVar32 = vshufps_avx(auVar27,auVar27,0xc9);
      auVar27 = vdpps_avx(auVar32,auVar32,0x7f);
      fVar55 = (ray->dir).field_0.m128[2];
      auVar28 = vrsqrtss_avx(auVar27,auVar27);
      fVar40 = auVar28._0_4_;
      auVar27 = ZEXT416((uint)(fVar40 * 1.5 - fVar40 * fVar40 * fVar40 * auVar27._0_4_ * 0.5));
      auVar27 = vshufps_avx(auVar27,auVar27,0);
      auVar28._0_4_ = auVar32._0_4_ * auVar27._0_4_;
      auVar28._4_4_ = auVar32._4_4_ * auVar27._4_4_;
      auVar28._8_4_ = auVar32._8_4_ * auVar27._8_4_;
      auVar28._12_4_ = auVar32._12_4_ * auVar27._12_4_;
      auVar27._0_4_ = auVar23._0_4_ * auVar38._0_4_;
      auVar27._4_4_ = auVar23._4_4_ * auVar38._4_4_;
      auVar27._8_4_ = auVar23._8_4_ * auVar38._8_4_;
      auVar27._12_4_ = auVar23._12_4_ * auVar38._12_4_;
      auVar32 = vunpcklps_avx(auVar43,auVar27);
      auVar27 = vunpckhps_avx(auVar43,auVar27);
      auVar23 = vunpcklps_avx(auVar28,auVar39);
      auVar28 = vunpckhps_avx(auVar28,auVar39);
      pre.ray_space.vz.field_0 =
           (anon_union_16_2_47237d3f_for_Vec3fa_0)vunpcklps_avx(auVar27,auVar28);
      pre.ray_space.vx.field_0 =
           (anon_union_16_2_47237d3f_for_Vec3fa_0)vunpcklps_avx(auVar32,auVar23);
      pre.ray_space.vy.field_0 =
           (anon_union_16_2_47237d3f_for_Vec3fa_0)vunpckhps_avx(auVar32,auVar23);
      pNVar14 = stack + 1;
      auVar28 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      auVar32._8_4_ = 0x7fffffff;
      auVar32._0_8_ = 0x7fffffff7fffffff;
      auVar32._12_4_ = 0x7fffffff;
      auVar27 = vandps_avx((undefined1  [16])aVar2,auVar32);
      auVar34._8_4_ = 0x219392ef;
      auVar34._0_8_ = 0x219392ef219392ef;
      auVar34._12_4_ = 0x219392ef;
      auVar27 = vcmpps_avx(auVar27,auVar34,1);
      auVar27 = vblendvps_avx((undefined1  [16])aVar2,auVar34,auVar27);
      stack[0].ptr = *(size_t *)&This->ptr[1].bounds.bounds0.lower.field_0;
      auVar32 = vrcpps_avx(auVar27);
      fVar40 = auVar32._0_4_;
      auVar23._0_4_ = auVar27._0_4_ * fVar40;
      fVar3 = auVar32._4_4_;
      auVar23._4_4_ = auVar27._4_4_ * fVar3;
      fVar4 = auVar32._8_4_;
      auVar23._8_4_ = auVar27._8_4_ * fVar4;
      fVar45 = auVar32._12_4_;
      auVar23._12_4_ = auVar27._12_4_ * fVar45;
      auVar35._8_4_ = 0x3f800000;
      auVar35._0_8_ = &DAT_3f8000003f800000;
      auVar35._12_4_ = 0x3f800000;
      auVar27 = vsubps_avx(auVar35,auVar23);
      auVar24._0_4_ = fVar40 + fVar40 * auVar27._0_4_;
      auVar24._4_4_ = fVar3 + fVar3 * auVar27._4_4_;
      auVar24._8_4_ = fVar4 + fVar4 * auVar27._8_4_;
      auVar24._12_4_ = fVar45 + fVar45 * auVar27._12_4_;
      fVar40 = (ray->org).field_0.m128[0];
      auVar70._4_4_ = fVar40;
      auVar70._0_4_ = fVar40;
      auVar70._8_4_ = fVar40;
      auVar70._12_4_ = fVar40;
      fVar3 = (ray->org).field_0.m128[1];
      auVar64._4_4_ = fVar3;
      auVar64._0_4_ = fVar3;
      auVar64._8_4_ = fVar3;
      auVar64._12_4_ = fVar3;
      fVar4 = (ray->org).field_0.m128[2];
      auVar66._4_4_ = fVar4;
      auVar66._0_4_ = fVar4;
      auVar66._8_4_ = fVar4;
      auVar66._12_4_ = fVar4;
      auVar27 = vmovshdup_avx(auVar24);
      uVar15 = (ulong)(auVar24._0_4_ < 0.0) * 0x10;
      auVar32 = vshufpd_avx(auVar24,auVar24,1);
      uVar17 = (ulong)(auVar27._0_4_ < 0.0) << 4 | 0x20;
      auVar27 = vshufps_avx(auVar24,auVar24,0);
      auVar23 = vshufps_avx(auVar24,auVar24,0x55);
      auVar24 = vshufps_avx(auVar24,auVar24,0xaa);
      uVar16 = (ulong)(auVar32._0_4_ < 0.0) << 4 | 0x40;
      auVar28 = vshufps_avx(auVar28,auVar28,0);
      auVar32 = vshufps_avx(ZEXT416((uint)fVar41),ZEXT416((uint)fVar41),0);
      do {
        if (pNVar14 == stack) {
          return;
        }
        uVar10 = pNVar14[-1].ptr;
        pNVar14 = pNVar14 + -1;
        do {
          if ((uVar10 & 0xf) == 0) {
            auVar39 = vsubps_avx(*(undefined1 (*) [16])(uVar10 + 0x20 + uVar15),auVar70);
            auVar18._0_4_ = auVar27._0_4_ * auVar39._0_4_;
            auVar18._4_4_ = auVar27._4_4_ * auVar39._4_4_;
            auVar18._8_4_ = auVar27._8_4_ * auVar39._8_4_;
            auVar18._12_4_ = auVar27._12_4_ * auVar39._12_4_;
            auVar39 = vsubps_avx(*(undefined1 (*) [16])(uVar10 + 0x20 + uVar17),auVar64);
            auVar20._0_4_ = auVar23._0_4_ * auVar39._0_4_;
            auVar20._4_4_ = auVar23._4_4_ * auVar39._4_4_;
            auVar20._8_4_ = auVar23._8_4_ * auVar39._8_4_;
            auVar20._12_4_ = auVar23._12_4_ * auVar39._12_4_;
            auVar39 = vpmaxsd_avx(auVar18,auVar20);
            auVar34 = vsubps_avx(*(undefined1 (*) [16])(uVar10 + 0x20 + uVar16),auVar66);
            auVar21._0_4_ = auVar24._0_4_ * auVar34._0_4_;
            auVar21._4_4_ = auVar24._4_4_ * auVar34._4_4_;
            auVar21._8_4_ = auVar24._8_4_ * auVar34._8_4_;
            auVar21._12_4_ = auVar24._12_4_ * auVar34._12_4_;
            auVar34 = vsubps_avx(*(undefined1 (*) [16])(uVar10 + 0x20 + (uVar15 ^ 0x10)),auVar70);
            auVar25._0_4_ = auVar27._0_4_ * auVar34._0_4_;
            auVar25._4_4_ = auVar27._4_4_ * auVar34._4_4_;
            auVar25._8_4_ = auVar27._8_4_ * auVar34._8_4_;
            auVar25._12_4_ = auVar27._12_4_ * auVar34._12_4_;
            auVar34 = vsubps_avx(*(undefined1 (*) [16])(uVar10 + 0x20 + (uVar17 ^ 0x10)),auVar64);
            auVar29._0_4_ = auVar23._0_4_ * auVar34._0_4_;
            auVar29._4_4_ = auVar23._4_4_ * auVar34._4_4_;
            auVar29._8_4_ = auVar23._8_4_ * auVar34._8_4_;
            auVar29._12_4_ = auVar23._12_4_ * auVar34._12_4_;
            auVar35 = vpminsd_avx(auVar25,auVar29);
            auVar34 = vsubps_avx(*(undefined1 (*) [16])(uVar10 + 0x20 + (uVar16 ^ 0x10)),auVar66);
            auVar30._0_4_ = auVar24._0_4_ * auVar34._0_4_;
            auVar30._4_4_ = auVar24._4_4_ * auVar34._4_4_;
            auVar30._8_4_ = auVar24._8_4_ * auVar34._8_4_;
            auVar30._12_4_ = auVar24._12_4_ * auVar34._12_4_;
            auVar34 = vpmaxsd_avx(auVar21,auVar28);
            auVar39 = vpmaxsd_avx(auVar39,auVar34);
            auVar34 = vpminsd_avx(auVar30,auVar32);
            auVar34 = vpminsd_avx(auVar35,auVar34);
            auVar39 = vpcmpgtd_avx(auVar39,auVar34);
            uVar7 = vmovmskps_avx(auVar39);
            unaff_R15 = (ulong)(byte)((byte)uVar7 ^ 0xf);
LAB_002d40cd:
            bVar5 = true;
          }
          else {
            if ((int)(uVar10 & 0xf) == 2) {
              uVar9 = uVar10 & 0xfffffffffffffff0;
              auVar58._0_4_ =
                   fVar55 * *(float *)(uVar9 + 0x80) + fVar1 * *(float *)(uVar9 + 0x50) +
                   fVar37 * *(float *)(uVar9 + 0x20);
              auVar58._4_4_ =
                   fVar55 * *(float *)(uVar9 + 0x84) + fVar1 * *(float *)(uVar9 + 0x54) +
                   fVar37 * *(float *)(uVar9 + 0x24);
              auVar58._8_4_ =
                   fVar55 * *(float *)(uVar9 + 0x88) + fVar1 * *(float *)(uVar9 + 0x58) +
                   fVar37 * *(float *)(uVar9 + 0x28);
              auVar58._12_4_ =
                   fVar55 * *(float *)(uVar9 + 0x8c) + fVar1 * *(float *)(uVar9 + 0x5c) +
                   fVar37 * *(float *)(uVar9 + 0x2c);
              auVar44._0_4_ =
                   fVar55 * *(float *)(uVar9 + 0x90) + fVar1 * *(float *)(uVar9 + 0x60) +
                   fVar37 * *(float *)(uVar9 + 0x30);
              auVar44._4_4_ =
                   fVar55 * *(float *)(uVar9 + 0x94) + fVar1 * *(float *)(uVar9 + 100) +
                   fVar37 * *(float *)(uVar9 + 0x34);
              auVar44._8_4_ =
                   fVar55 * *(float *)(uVar9 + 0x98) + fVar1 * *(float *)(uVar9 + 0x68) +
                   fVar37 * *(float *)(uVar9 + 0x38);
              auVar44._12_4_ =
                   fVar55 * *(float *)(uVar9 + 0x9c) + fVar1 * *(float *)(uVar9 + 0x6c) +
                   fVar37 * *(float *)(uVar9 + 0x3c);
              auVar50._0_4_ =
                   fVar55 * *(float *)(uVar9 + 0xa0) + fVar1 * *(float *)(uVar9 + 0x70) +
                   fVar37 * *(float *)(uVar9 + 0x40);
              auVar50._4_4_ =
                   fVar55 * *(float *)(uVar9 + 0xa4) + fVar1 * *(float *)(uVar9 + 0x74) +
                   fVar37 * *(float *)(uVar9 + 0x44);
              auVar50._8_4_ =
                   fVar55 * *(float *)(uVar9 + 0xa8) + fVar1 * *(float *)(uVar9 + 0x78) +
                   fVar37 * *(float *)(uVar9 + 0x48);
              auVar50._12_4_ =
                   fVar55 * *(float *)(uVar9 + 0xac) + fVar1 * *(float *)(uVar9 + 0x7c) +
                   fVar37 * *(float *)(uVar9 + 0x4c);
              auVar67._8_4_ = 0x7fffffff;
              auVar67._0_8_ = 0x7fffffff7fffffff;
              auVar67._12_4_ = 0x7fffffff;
              auVar39 = vandps_avx(auVar58,auVar67);
              auVar68._8_4_ = 0x219392ef;
              auVar68._0_8_ = 0x219392ef219392ef;
              auVar68._12_4_ = 0x219392ef;
              auVar39 = vcmpps_avx(auVar39,auVar68,1);
              auVar34 = vblendvps_avx(auVar58,auVar68,auVar39);
              auVar39 = vandps_avx(auVar44,auVar67);
              auVar39 = vcmpps_avx(auVar39,auVar68,1);
              auVar35 = vblendvps_avx(auVar44,auVar68,auVar39);
              auVar39 = vandps_avx(auVar50,auVar67);
              auVar39 = vcmpps_avx(auVar39,auVar68,1);
              auVar39 = vblendvps_avx(auVar50,auVar68,auVar39);
              auVar38 = vrcpps_avx(auVar34);
              fVar41 = auVar38._0_4_;
              auVar51._0_4_ = fVar41 * auVar34._0_4_;
              fVar45 = auVar38._4_4_;
              auVar51._4_4_ = fVar45 * auVar34._4_4_;
              fVar46 = auVar38._8_4_;
              auVar51._8_4_ = fVar46 * auVar34._8_4_;
              fVar47 = auVar38._12_4_;
              auVar51._12_4_ = fVar47 * auVar34._12_4_;
              auVar69._8_4_ = 0x3f800000;
              auVar69._0_8_ = &DAT_3f8000003f800000;
              auVar69._12_4_ = 0x3f800000;
              auVar34 = vsubps_avx(auVar69,auVar51);
              fVar41 = fVar41 + fVar41 * auVar34._0_4_;
              fVar45 = fVar45 + fVar45 * auVar34._4_4_;
              fVar46 = fVar46 + fVar46 * auVar34._8_4_;
              fVar47 = fVar47 + fVar47 * auVar34._12_4_;
              auVar34 = vrcpps_avx(auVar35);
              fVar48 = auVar34._0_4_;
              auVar59._0_4_ = fVar48 * auVar35._0_4_;
              fVar52 = auVar34._4_4_;
              auVar59._4_4_ = fVar52 * auVar35._4_4_;
              fVar53 = auVar34._8_4_;
              auVar59._8_4_ = fVar53 * auVar35._8_4_;
              fVar54 = auVar34._12_4_;
              auVar59._12_4_ = fVar54 * auVar35._12_4_;
              auVar34 = vsubps_avx(auVar69,auVar59);
              fVar48 = fVar48 + fVar48 * auVar34._0_4_;
              fVar52 = fVar52 + fVar52 * auVar34._4_4_;
              fVar53 = fVar53 + fVar53 * auVar34._8_4_;
              fVar54 = fVar54 + fVar54 * auVar34._12_4_;
              auVar34 = vrcpps_avx(auVar39);
              fVar56 = auVar34._0_4_;
              auVar65._0_4_ = fVar56 * auVar39._0_4_;
              fVar60 = auVar34._4_4_;
              auVar65._4_4_ = fVar60 * auVar39._4_4_;
              fVar61 = auVar34._8_4_;
              auVar65._8_4_ = fVar61 * auVar39._8_4_;
              fVar62 = auVar34._12_4_;
              auVar65._12_4_ = fVar62 * auVar39._12_4_;
              auVar39 = vsubps_avx(auVar69,auVar65);
              fVar56 = fVar56 + fVar56 * auVar39._0_4_;
              fVar60 = fVar60 + fVar60 * auVar39._4_4_;
              fVar61 = fVar61 + fVar61 * auVar39._8_4_;
              fVar62 = fVar62 + fVar62 * auVar39._12_4_;
              auVar26._0_4_ =
                   (fVar40 * *(float *)(uVar9 + 0x20) +
                   fVar3 * *(float *)(uVar9 + 0x50) +
                   fVar4 * *(float *)(uVar9 + 0x80) + *(float *)(uVar9 + 0xb0)) * -fVar41;
              auVar26._4_4_ =
                   (fVar40 * *(float *)(uVar9 + 0x24) +
                   fVar3 * *(float *)(uVar9 + 0x54) +
                   fVar4 * *(float *)(uVar9 + 0x84) + *(float *)(uVar9 + 0xb4)) * -fVar45;
              auVar26._8_4_ =
                   (fVar40 * *(float *)(uVar9 + 0x28) +
                   fVar3 * *(float *)(uVar9 + 0x58) +
                   fVar4 * *(float *)(uVar9 + 0x88) + *(float *)(uVar9 + 0xb8)) * -fVar46;
              auVar26._12_4_ =
                   (fVar40 * *(float *)(uVar9 + 0x2c) +
                   fVar3 * *(float *)(uVar9 + 0x5c) +
                   fVar4 * *(float *)(uVar9 + 0x8c) + *(float *)(uVar9 + 0xbc)) * -fVar47;
              auVar22._0_4_ =
                   (fVar40 * *(float *)(uVar9 + 0x30) +
                   fVar3 * *(float *)(uVar9 + 0x60) +
                   fVar4 * *(float *)(uVar9 + 0x90) + *(float *)(uVar9 + 0xc0)) * -fVar48;
              auVar22._4_4_ =
                   (fVar40 * *(float *)(uVar9 + 0x34) +
                   fVar3 * *(float *)(uVar9 + 100) +
                   fVar4 * *(float *)(uVar9 + 0x94) + *(float *)(uVar9 + 0xc4)) * -fVar52;
              auVar22._8_4_ =
                   (fVar40 * *(float *)(uVar9 + 0x38) +
                   fVar3 * *(float *)(uVar9 + 0x68) +
                   fVar4 * *(float *)(uVar9 + 0x98) + *(float *)(uVar9 + 200)) * -fVar53;
              auVar22._12_4_ =
                   (fVar40 * *(float *)(uVar9 + 0x3c) +
                   fVar3 * *(float *)(uVar9 + 0x6c) +
                   fVar4 * *(float *)(uVar9 + 0x9c) + *(float *)(uVar9 + 0xcc)) * -fVar54;
              auVar19._0_4_ =
                   (fVar40 * *(float *)(uVar9 + 0x40) +
                   fVar3 * *(float *)(uVar9 + 0x70) +
                   fVar4 * *(float *)(uVar9 + 0xa0) + *(float *)(uVar9 + 0xd0)) * -fVar56;
              auVar19._4_4_ =
                   (fVar40 * *(float *)(uVar9 + 0x44) +
                   fVar3 * *(float *)(uVar9 + 0x74) +
                   fVar4 * *(float *)(uVar9 + 0xa4) + *(float *)(uVar9 + 0xd4)) * -fVar60;
              auVar19._8_4_ =
                   (fVar40 * *(float *)(uVar9 + 0x48) +
                   fVar3 * *(float *)(uVar9 + 0x78) +
                   fVar4 * *(float *)(uVar9 + 0xa8) + *(float *)(uVar9 + 0xd8)) * -fVar61;
              auVar19._12_4_ =
                   (fVar40 * *(float *)(uVar9 + 0x4c) +
                   fVar3 * *(float *)(uVar9 + 0x7c) +
                   fVar4 * *(float *)(uVar9 + 0xac) + *(float *)(uVar9 + 0xdc)) * -fVar62;
              auVar31._0_4_ = fVar41 + auVar26._0_4_;
              auVar31._4_4_ = fVar45 + auVar26._4_4_;
              auVar31._8_4_ = fVar46 + auVar26._8_4_;
              auVar31._12_4_ = fVar47 + auVar26._12_4_;
              auVar33._0_4_ = fVar48 + auVar22._0_4_;
              auVar33._4_4_ = fVar52 + auVar22._4_4_;
              auVar33._8_4_ = fVar53 + auVar22._8_4_;
              auVar33._12_4_ = fVar54 + auVar22._12_4_;
              auVar36._0_4_ = fVar56 + auVar19._0_4_;
              auVar36._4_4_ = fVar60 + auVar19._4_4_;
              auVar36._8_4_ = fVar61 + auVar19._8_4_;
              auVar36._12_4_ = fVar62 + auVar19._12_4_;
              auVar39 = vpminsd_avx(auVar22,auVar33);
              auVar34 = vpminsd_avx(auVar19,auVar36);
              auVar39 = vmaxps_avx(auVar39,auVar34);
              auVar42 = vpminsd_avx(auVar26,auVar31);
              auVar38 = vpmaxsd_avx(auVar26,auVar31);
              auVar34 = vpmaxsd_avx(auVar22,auVar33);
              auVar35 = vpmaxsd_avx(auVar19,auVar36);
              auVar35 = vminps_avx(auVar34,auVar35);
              auVar34 = vmaxps_avx(auVar28,auVar42);
              auVar39 = vmaxps_avx(auVar34,auVar39);
              auVar34 = vminps_avx(auVar32,auVar38);
              auVar34 = vminps_avx(auVar34,auVar35);
              auVar39 = vcmpps_avx(auVar39,auVar34,2);
              uVar7 = vmovmskps_avx(auVar39);
              unaff_R15 = CONCAT44((int)(unaff_R15 >> 0x20),uVar7);
              goto LAB_002d40cd;
            }
            bVar5 = false;
          }
          if (bVar5) {
            if (unaff_R15 == 0) {
              iVar11 = 4;
            }
            else {
              uVar9 = uVar10 & 0xfffffffffffffff0;
              lVar13 = 0;
              if (unaff_R15 != 0) {
                for (; (unaff_R15 >> lVar13 & 1) == 0; lVar13 = lVar13 + 1) {
                }
              }
              iVar11 = 0;
              uVar10 = *(ulong *)(uVar9 + lVar13 * 8);
              uVar12 = unaff_R15 - 1 & unaff_R15;
              if (uVar12 != 0) {
                pNVar14->ptr = uVar10;
                lVar13 = 0;
                if (uVar12 != 0) {
                  for (; (uVar12 >> lVar13 & 1) == 0; lVar13 = lVar13 + 1) {
                  }
                }
                uVar8 = uVar12 - 1;
                while( true ) {
                  pNVar14 = pNVar14 + 1;
                  uVar10 = *(ulong *)(uVar9 + lVar13 * 8);
                  uVar8 = uVar8 & uVar12;
                  if (uVar8 == 0) break;
                  pNVar14->ptr = uVar10;
                  lVar13 = 0;
                  if (uVar8 != 0) {
                    for (; (uVar8 >> lVar13 & 1) == 0; lVar13 = lVar13 + 1) {
                    }
                  }
                  uVar12 = uVar8 - 1;
                }
              }
            }
          }
          else {
            iVar11 = 6;
          }
        } while (iVar11 == 0);
        if (iVar11 == 6) {
          cVar6 = (**(code **)((long)This->leafIntersector +
                              (ulong)*(byte *)(uVar10 & 0xfffffffffffffff0) * 0x40 + 8))
                            (&pre,ray,context);
          iVar11 = 0;
          if (cVar6 != '\0') {
            ray->tfar = -INFINITY;
            iVar11 = 3;
          }
        }
      } while (iVar11 != 3);
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }